

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_linux.cpp
# Opt level: O0

void read_disk_labels(vector<DiskInfo,_std::allocator<DiskInfo>_> *disk_infos)

{
  __syscall_slong_t this;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  reference paVar4;
  int *piVar5;
  double __x;
  double __x_00;
  double __x_01;
  anon_struct_1296_7_5326303c *diskInfo;
  iterator __end4;
  iterator __begin4;
  vector<DiskInfo,_std::allocator<DiskInfo>_> *__range4;
  undefined1 local_128 [7];
  bool found;
  undefined1 local_108 [8];
  string cur_disk_label;
  DIR *disk_by_label;
  allocator local_c9;
  undefined1 local_c8 [8];
  string label_dir;
  dirent *dir;
  stat sym_stat;
  vector<DiskInfo,_std::allocator<DiskInfo>_> *disk_infos_local;
  
  sym_stat.__glibc_reserved[2] = (__syscall_slong_t)disk_infos;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_c8,"/dev/disk/by-label",&local_c9);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cur_disk_label.field_2._8_8_ = opendir(pcVar3);
  if ((DIR *)cur_disk_label.field_2._8_8_ == (DIR *)0x0) {
    std::__cxx11::string::operator=((string *)local_c8,"/dev/disk/by-partlabel");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cur_disk_label.field_2._8_8_ = opendir(pcVar3);
  }
  if (cur_disk_label.field_2._8_8_ == 0) {
    std::__cxx11::string::c_str();
    piVar5 = __errno_location();
    strerror(*piVar5);
    _log(__x_01);
  }
  else {
    while (label_dir.field_2._8_8_ = (size_type)readdir(cur_disk_label.field_2._8_8_),
          (dirent *)label_dir.field_2._8_8_ != (dirent *)0x0) {
      iVar2 = strcmp(((dirent *)label_dir.field_2._8_8_)->d_name,".");
      if ((iVar2 != 0) &&
         (iVar2 = strcmp((char *)(label_dir.field_2._8_8_ + 0x13),".."), iVar2 != 0)) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_128,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8
                       ,"/");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_108,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_128,(char *)(label_dir.field_2._8_8_ + 0x13));
        std::__cxx11::string::~string((string *)local_128);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        iVar2 = stat(pcVar3,(stat *)&dir);
        this = sym_stat.__glibc_reserved[2];
        if (iVar2 == 0) {
          __end4 = std::vector<DiskInfo,_std::allocator<DiskInfo>_>::begin
                             ((vector<DiskInfo,_std::allocator<DiskInfo>_> *)
                              sym_stat.__glibc_reserved[2]);
          diskInfo = (anon_struct_1296_7_5326303c *)
                     std::vector<DiskInfo,_std::allocator<DiskInfo>_>::end
                               ((vector<DiskInfo,_std::allocator<DiskInfo>_> *)this);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end4,(__normal_iterator<DiskInfo_*,_std::vector<DiskInfo,_std::allocator<DiskInfo>_>_>
                                             *)&diskInfo), bVar1) {
            paVar4 = __gnu_cxx::
                     __normal_iterator<DiskInfo_*,_std::vector<DiskInfo,_std::allocator<DiskInfo>_>_>
                     ::operator*(&__end4);
            if ((int)sym_stat.st_dev == paVar4->id) {
              license::mstrlcpy(paVar4->label,(char *)(label_dir.field_2._8_8_ + 0x13),0xff);
              paVar4->label_initialized = true;
              _log(__x);
              break;
            }
            __gnu_cxx::
            __normal_iterator<DiskInfo_*,_std::vector<DiskInfo,_std::allocator<DiskInfo>_>_>::
            operator++(&__end4);
          }
        }
        else {
          std::__cxx11::string::c_str();
          piVar5 = __errno_location();
          strerror(*piVar5);
          _log(__x_00);
        }
        std::__cxx11::string::~string((string *)local_108);
      }
    }
    closedir((DIR *)cur_disk_label.field_2._8_8_);
  }
  std::__cxx11::string::~string((string *)local_c8);
  return;
}

Assistant:

static void read_disk_labels(std::vector<DiskInfo> &disk_infos) {
	struct stat sym_stat;
	struct dirent *dir;

	std::string label_dir("/dev/disk/by-label");
	DIR *disk_by_label = opendir(label_dir.c_str());
	if (disk_by_label == nullptr) {
		label_dir = "/dev/disk/by-partlabel";
		disk_by_label = opendir(label_dir.c_str());
	}
	if (disk_by_label != nullptr) {
		while ((dir = readdir(disk_by_label)) != nullptr) {
			if (strcmp(dir->d_name, ".") == 0 || strcmp(dir->d_name, "..") == 0) {
				continue;
			}
			std::string cur_disk_label = label_dir + "/" + dir->d_name;
			if (stat(cur_disk_label.c_str(), &sym_stat) == 0) {
				bool found = false;
				for (auto &diskInfo : disk_infos) {
					if (((int)(sym_stat.st_ino)) == diskInfo.id) {
						mstrlcpy(diskInfo.label, dir->d_name, 255);
						diskInfo.label_initialized = true;
						LOG_DEBUG("Label for disk ino %d device %s, set to %s", sym_stat.st_ino, diskInfo.device,
								  diskInfo.label);
						break;
					}
				}
			} else {
				LOG_DEBUG("Stat %s for fail:F %s", cur_disk_label.c_str(), std::strerror(errno));
			}
		}
		closedir(disk_by_label);
	} else {
		LOG_DEBUG("Open %s for reading disk labels fail: %s", label_dir.c_str(), std::strerror(errno));
	}
}